

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O2

size_t ngx_http_log_variable_getlen(ngx_http_request_t *r,uintptr_t data)

{
  uint uVar1;
  ngx_http_variable_value_t *pnVar2;
  uintptr_t uVar3;
  size_t sVar4;
  
  pnVar2 = ngx_http_get_indexed_variable(r,data);
  sVar4 = 1;
  if ((pnVar2 != (ngx_http_variable_value_t *)0x0) && ((*(uint *)pnVar2 >> 0x1e & 1) == 0)) {
    uVar3 = ngx_http_log_escape((u_char *)0x0,pnVar2->data,(ulong)*(uint *)pnVar2 & 0xfffffff);
    uVar1 = *(uint *)pnVar2;
    *(uint *)pnVar2 = uVar1 & 0x7fffffff | (uint)(uVar3 != 0) << 0x1f;
    sVar4 = uVar3 * 3 + ((ulong)uVar1 & 0xfffffff);
  }
  return sVar4;
}

Assistant:

static size_t
ngx_http_log_variable_getlen(ngx_http_request_t *r, uintptr_t data)
{
    uintptr_t                   len;
    ngx_http_variable_value_t  *value;

    value = ngx_http_get_indexed_variable(r, data);

    if (value == NULL || value->not_found) {
        return 1;
    }

    len = ngx_http_log_escape(NULL, value->data, value->len);

    value->escape = len ? 1 : 0;

    return value->len + len * 3;
}